

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChContactTriangleXYZ::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChContactTriangleXYZ *this,double U,double V)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChVector<double> result;
  ChVector<double> local_b8;
  double local_98;
  double local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             &(this->mnode1).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  local_48 = *(double *)&((ChNodeFEAbase *)local_b8.m_data[0])->field_0x20;
  local_68 = *(double *)((long)local_b8.m_data[0] + 0x28);
  uStack_60 = *(undefined8 *)((long)local_b8.m_data[0] + 0x30);
  local_58 = *(undefined8 *)((long)local_b8.m_data[0] + 0x30);
  uStack_40 = 0;
  uStack_50 = local_58;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8.m_data + 1));
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             &(this->mnode2).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  local_90 = *(double *)&((ChNodeFEAbase *)local_b8.m_data[0])->field_0x20;
  local_78 = *(undefined8 *)((long)local_b8.m_data[0] + 0x28);
  uStack_70 = *(undefined8 *)((long)local_b8.m_data[0] + 0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8.m_data + 1));
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             &(this->mnode3).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  local_98 = *(double *)((long)local_b8.m_data[0] + 0x28);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)((long)local_b8.m_data[0] + 0x30);
  local_88 = vmovhps_avx(auVar5,*(undefined8 *)&((ChNodeFEAbase *)local_b8.m_data[0])->field_0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8.m_data + 1));
  auVar1._8_8_ = uStack_60;
  auVar1._0_8_ = local_68;
  auVar3._8_8_ = uStack_70;
  auVar3._0_8_ = local_78;
  auVar4._8_8_ = uStack_40;
  auVar4._0_8_ = local_48;
  auVar1 = vsubpd_avx(auVar3,auVar1);
  auVar2._8_8_ = uStack_50;
  auVar2._0_8_ = local_58;
  auVar3 = vunpcklpd_avx(auVar2,auVar4);
  auVar2 = vsubpd_avx(local_88,auVar3);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_90 - local_48;
  auVar3 = vshufpd_avx(auVar1,auVar6,1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_98 - local_68;
  auVar4 = vunpcklpd_avx(auVar8,auVar2);
  auVar9._0_8_ = auVar4._0_8_ * auVar3._0_8_;
  auVar9._8_8_ = auVar4._8_8_ * auVar3._8_8_;
  local_b8.m_data._0_16_ = vfmsub231pd_fma(auVar9,auVar1,auVar2);
  auVar3 = vshufpd_avx(auVar2,auVar2,1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar3._0_8_ * auVar1._0_8_;
  auVar3 = vfmsub231sd_fma(auVar7,auVar6,auVar8);
  local_b8.m_data[2] = auVar3._0_8_;
  ChVector<double>::GetNormalized(__return_storage_ptr__,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChContactTriangleXYZ::ComputeNormal(const double U, const double V) {
    ChVector<> p0 = GetNode1()->GetPos();
    ChVector<> p1 = GetNode2()->GetPos();
    ChVector<> p2 = GetNode3()->GetPos();
    return Vcross(p1 - p0, p2 - p0).GetNormalized();
}